

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

int __thiscall
lzham::adaptive_arith_data_model::init(adaptive_arith_data_model *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined8 extraout_RAX;
  undefined7 extraout_var;
  uint32 in_EDX;
  
  if (in_EDX != 1) {
    if (in_EDX == 0) {
      clear(this);
      return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    if ((in_EDX & in_EDX - 1) == 0) goto LAB_0011cbf9;
  }
  in_EDX = math::next_pow2(in_EDX);
LAB_0011cbf9:
  this->m_total_syms = in_EDX;
  bVar1 = vector<lzham::adaptive_bit_model>::try_resize(&this->m_probs,in_EDX,false);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool adaptive_arith_data_model::init(bool encoding, uint total_syms)
   {
      encoding;
      if (!total_syms)
      {
         clear();
         return true;
      }

      if ((total_syms < 2) || (!math::is_power_of_2(total_syms)))
         total_syms = math::next_pow2(total_syms);

      m_total_syms = total_syms;

      if (!m_probs.try_resize(m_total_syms))
         return false;

      return true;
   }